

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
storage(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this,
       random_engine *rng,default_cost_type<long_double> *costs_,double cost_constant_,
       int population_size,int variables,
       vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       *constraints_)

{
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  *this_00;
  bit_array *this_01;
  index *piVar1;
  uint uVar2;
  pointer prVar3;
  pointer pfVar4;
  int *piVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  pointer pmVar10;
  int iVar11;
  raw_result<baryonyx::itm::maximize_tag> *elem;
  pointer prVar12;
  long lVar13;
  long lVar14;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  pointer pfVar15;
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  *__range3;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 in_XMM3_Qb;
  bit_array_impl local_40;
  
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_indices_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x30) = 0;
  (this->m_indices_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x18) = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->m_indices,(long)population_size,(allocator_type *)&local_40);
  this_00 = &this->m_data;
  std::
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  ::vector(this_00,(long)population_size,(allocator_type *)&local_40);
  this_01 = &this->m_bastert;
  bit_array_impl::bit_array_impl(&this_01->super_bit_array_impl,variables);
  bit_array_impl::bit_array_impl(&(this->m_random).super_bit_array_impl,variables);
  this->costs = costs_;
  this->cost_constant = cost_constant_;
  this->m_size = population_size;
  prVar3 = (this->m_data).
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar12 = (this->m_data).
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; prVar12 != prVar3; prVar12 = prVar12 + 1
      ) {
    bit_array_impl::bit_array_impl(&local_40,variables);
    bit_array_impl::operator=((bit_array_impl *)prVar12,&local_40);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              (&local_40.m_data);
  }
  init_with_bastert<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
            (this_01,costs_,variables,0);
  uVar8 = (long)this->m_size / 2;
  for (uVar16 = 0; uVar16 != (uVar8 & 0xffffffff); uVar16 = uVar16 + 1) {
    bit_array_impl::operator=
              ((bit_array_impl *)
               ((this_00->
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar16),&this_01->super_bit_array_impl)
    ;
    auVar18._0_8_ = (double)(int)uVar16 / (double)((int)uVar8 * 5);
    auVar18._8_8_ = in_XMM3_Qb;
    iVar11 = 0;
    auVar19 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar18);
    uVar6 = vcmpsd_avx512f(auVar18,ZEXT816(0),1);
    for (; variables != iVar11; iVar11 = iVar11 + 1) {
      dVar17 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
      if (dVar17 < (double)((ulong)!(bool)((byte)uVar6 & 1) * auVar19._0_8_)) {
        bit_array_impl::invert
                  ((bit_array_impl *)
                   ((this_00->
                    super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar16),iVar11);
      }
    }
  }
  iVar11 = this->m_size;
  lVar14 = (long)(int)((long)iVar11 / 2);
  uVar8 = (long)iVar11 / 2 & 0xffffffff;
  lVar13 = lVar14 * 0x38;
  for (lVar14 = lVar14 + 1; lVar14 < iVar11; lVar14 = lVar14 + 2) {
    init_with_random((bit_array *)
                     ((long)&(((this_00->
                               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->x).super_bit_array_impl.
                             m_size + lVar13),rng,variables,0.2);
    init_with_random((bit_array *)
                     ((long)&(this_00->
                             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1].x.super_bit_array_impl.
                             m_size + lVar13),rng,variables,0.8);
    auVar19._0_8_ = (double)(int)uVar8 / (double)(iVar11 * 5);
    auVar19._8_8_ = in_XMM3_Qb;
    prVar12 = (this_00->
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = vcmpsd_avx512f(auVar19,ZEXT816(0) << 0x40,1);
    auVar19 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar19);
    init_with_pre_solve<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)((long)&(prVar12->x).super_bit_array_impl.m_size + lVar13),
               (bit_array *)((long)&prVar12[1].x.super_bit_array_impl.m_size + lVar13),rng,costs_,
               constraints_,(double)((ulong)!(bool)((byte)uVar6 & 1) * auVar19._0_8_));
    uVar8 = (ulong)((int)uVar8 + 2);
    lVar13 = lVar13 + 0x70;
  }
  uVar2 = this->m_size;
  for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
    raw_result<baryonyx::itm::maximize_tag>::make_hash
              ((this->m_data).
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar8);
    dVar17 = default_cost_type<long_double>::results
                       (this->costs,
                        &(this->m_data).
                         super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8].x,cost_constant_);
    prVar12 = (this->m_data).
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    prVar12[uVar8].value = dVar17;
    prVar12[uVar8].remaining_constraints = 0;
    pmVar10 = (constraints_->
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(constraints_->
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar10;
    for (uVar16 = 0; uVar16 != (lVar13 / 0x28 & 0xffffffffU); uVar16 = uVar16 + 1) {
      iVar11 = 0;
      pfVar4 = *(pointer *)
                ((long)&pmVar10[uVar16].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      for (pfVar15 = *(pointer *)
                      &pmVar10[uVar16].elements.
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl; pfVar15 != pfVar4; pfVar15 = pfVar15 + 1) {
        iVar7 = bit_array::operator[]
                          (&(this_00->
                            super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8].x,
                           pfVar15->variable_index);
        if (iVar7 != 0) {
          iVar7 = pfVar15->factor;
        }
        iVar11 = iVar11 + iVar7;
      }
      pmVar10 = (constraints_->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((iVar11 < pmVar10[uVar16].min) || (pmVar10[uVar16].max < iVar11)) {
        piVar1 = &(this_00->
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar8].remaining_constraints;
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  iVar11 = 0;
  piVar5 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar9 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar9 != piVar5; piVar9 = piVar9 + 1) {
    *piVar9 = iVar11;
    iVar11 = iVar11 + 1;
  }
  sort(this);
  return;
}

Assistant:

storage(random_engine& rng,
            const Cost& costs_,
            const double cost_constant_,
            const int population_size,
            const int variables,
            const std::vector<merged_constraint>& constraints_)
      : m_indices(population_size)
      , m_data(population_size)
      , m_bastert(variables)
      , m_random(variables)
      , costs(costs_)
      , cost_constant(cost_constant_)
      , m_size(population_size)
    {
        for (auto& elem : m_data)
            elem.x = bit_array(variables);

        init_with_bastert<Cost, Mode>(m_bastert, costs_, variables, 0);

        for (int i = 0, e = m_size / 2; i != e; ++i) {
            m_data[i].x = m_bastert;

            std::bernoulli_distribution dist(
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));

            for (int v = 0; v != variables; ++v)
                if (dist(rng))
                    m_data[i].x.invert(v);
        }

        for (int i = m_size / 2, e = m_size; i + 1 < e; i += 2) {
            init_with_random(m_data[i].x, rng, variables, 0.2);
            init_with_random(m_data[i + 1].x, rng, variables, 0.8);

            init_with_pre_solve<Cost, Mode>(
              m_data[i].x,
              m_data[i + 1].x,
              rng,
              costs_,
              constraints_,
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));
        }

        for (int i = 0, e = m_size; i != e; ++i) {
            m_data[i].make_hash();
            m_data[i].value = costs.results(m_data[i].x, cost_constant_);
            m_data[i].remaining_constraints = 0;

            for (int k = 0, end_k = length(constraints_); k != end_k; ++k) {
                int sum = 0;
                for (const auto& elem : constraints_[k].elements) {
                    if (m_data[i].x[elem.variable_index])
                        sum += elem.factor;
                }

                if (!(constraints_[k].min <= sum &&
                      sum <= constraints_[k].max))
                    ++m_data[i].remaining_constraints;
            }
        }

        std::iota(std::begin(m_indices), std::end(m_indices), 0);

        sort();
    }